

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::StringToInt64Map::MergeFrom(StringToInt64Map *this,StringToInt64Map *from)

{
  void *pvVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/DataStructures.pb.cc"
               ,0x166);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::
  MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
  ::MergeFrom(&this->map_,&from->map_);
  return;
}

Assistant:

void StringToInt64Map::MergeFrom(const StringToInt64Map& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.StringToInt64Map)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  map_.MergeFrom(from.map_);
}